

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void handle_child_message(sockaddr_in addr_from)

{
  uint uVar1;
  undefined1 *puVar2;
  int iVar3;
  FILE *__stream;
  undefined8 uVar4;
  uchar auVar5 [8];
  const_iterator cVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  uchar extraout_RDX [8];
  uchar extraout_RDX_00 [8];
  uchar auVar10 [8];
  _Base_ptr p_Var11;
  ulong __n;
  sockaddr_in addr;
  int id_chld;
  sockaddr_in local_448;
  Ip_Port ip_port;
  undefined1 local_428 [16];
  char str_addr [1000];
  
  uVar1 = *(uint *)((long)buf + 8);
  __n = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  strncpy(str_addr,(char *)((long)buf + 0xc),__n);
  auVar10 = extraout_RDX;
  uVar4 = addr_from._0_8_;
  auVar5 = addr_from.sin_zero;
  if (str_addr[0] != '0') {
    str_addr[__n] = '\0';
    parse_address(str_addr,&local_448);
    auVar10 = extraout_RDX_00;
    uVar4 = local_448._0_8_;
    auVar5 = local_448.sin_zero;
  }
  local_448.sin_zero = auVar5;
  local_448._0_8_ = uVar4;
  uVar4 = local_448._0_8_;
  __stream = _stderr;
  addr.sin_zero[0] = auVar10[0];
  addr.sin_zero[1] = auVar10[1];
  addr.sin_zero[2] = auVar10[2];
  addr.sin_zero[3] = auVar10[3];
  addr.sin_zero[4] = auVar10[4];
  addr.sin_zero[5] = auVar10[5];
  addr.sin_zero[6] = auVar10[6];
  addr.sin_zero[7] = auVar10[7];
  addr.sin_family = local_448.sin_family;
  addr.sin_port = local_448.sin_port;
  addr.sin_addr.s_addr = local_448.sin_addr.s_addr;
  pack_address_abi_cxx11_((string *)&ip_port,addr);
  fprintf(__stream,"Receive child with address: %s\n",
          CONCAT26(ip_port._6_2_,CONCAT24(ip_port.second,ip_port.first)));
  puVar2 = (undefined1 *)CONCAT26(ip_port._6_2_,CONCAT24(ip_port.second,ip_port.first));
  if (puVar2 != local_428) {
    operator_delete(puVar2);
  }
  ip_port.first = SUB84(uVar4,4);
  ip_port.second = SUB82(uVar4,2);
  cVar6 = std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_short>,_std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::find(&idconnections._M_t,&ip_port);
  iVar3 = global_map_id;
  if ((_Rb_tree_header *)cVar6._M_node == &idconnections._M_t._M_impl.super__Rb_tree_header) {
    pmVar7 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&ip_port);
    *pmVar7 = iVar3;
    pmVar8 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&global_map_id);
    pmVar8->sin_family = local_448.sin_family;
    pmVar8->sin_port = local_448.sin_port;
    pmVar8->sin_addr = (in_addr)local_448.sin_addr.s_addr;
    *&pmVar8->sin_zero = local_448.sin_zero;
    global_map_id = global_map_id + 1;
  }
  pmVar7 = std::
           map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
           ::operator[](&idconnections,&ip_port);
  id_chld = *pmVar7;
  if (children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var9 = &children._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var11 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (id_chld <= (int)p_Var11[1]._M_color) {
        p_Var9 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < id_chld];
    } while (p_Var11 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var9 != &children._M_t._M_impl.super__Rb_tree_header) &&
       ((int)p_Var9[1]._M_color <= id_chld)) {
      return;
    }
  }
  fwrite("Insert this new child to set\n",0x1d,1,_stderr);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&children,
             &id_chld);
  return;
}

Assistant:

void handle_child_message(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }
    fprintf(stderr, "Receive child with address: %s\n", pack_address(addr).c_str());

    Ip_Port ip_port = get_ip_port(addr);
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        ++global_map_id;
    }

    int id_chld = idconnections[ip_port];
    if (!children.count(id_chld)) {
        fprintf(stderr, "Insert this new child to set\n");
        children.insert(id_chld);
    }
}